

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

IXML_NodeList * ixmlNode_getChildNodes(IXML_Node_conflict *nodeptr)

{
  IXML_Node_conflict *add;
  int iVar1;
  Nodeptr *pp_Var2;
  IXML_NodeList *newNodeList;
  
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    return (IXML_NodeList *)0x0;
  }
  newNodeList = (IXML_NodeList *)malloc(0x10);
  if (newNodeList != (IXML_NodeList *)0x0) {
    ixmlNodeList_init(newNodeList);
    pp_Var2 = &nodeptr->firstChild;
    do {
      add = *pp_Var2;
      if (add == (IXML_Node_conflict *)0x0) {
        return newNodeList;
      }
      iVar1 = ixmlNodeList_addToNodeList(&newNodeList,add);
      pp_Var2 = &add->nextSibling;
    } while (iVar1 == 0);
    ixmlNodeList_free(newNodeList);
  }
  return (IXML_NodeList *)0x0;
}

Assistant:

IXML_NodeList *ixmlNode_getChildNodes(IXML_Node *nodeptr)
{
	IXML_Node *tempNode;
	IXML_NodeList *newNodeList;
	int rc;

	if (nodeptr == NULL) {
		return NULL;
	}

	newNodeList = (IXML_NodeList *)malloc(sizeof(IXML_NodeList));
	if (newNodeList == NULL) {
		return NULL;
	}

	ixmlNodeList_init(newNodeList);
	tempNode = nodeptr->firstChild;
	while (tempNode != NULL) {
		rc = ixmlNodeList_addToNodeList(&newNodeList, tempNode);
		if (rc != IXML_SUCCESS) {
			ixmlNodeList_free(newNodeList);
			return NULL;
		}

		tempNode = tempNode->nextSibling;
	}

	return newNodeList;
}